

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  ggml_tensor *pgVar2;
  void *pvVar3;
  pointer ppgVar4;
  pointer ppgVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  undefined8 uVar11;
  string *__return_storage_ptr__;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ggml_tensor *pgVar15;
  long lVar16;
  undefined8 uVar17;
  bool skip_empty_lines;
  bool skip_empty_lines_00;
  uint uVar18;
  string *str;
  string *str_00;
  int i;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 with_data;
  char *pcVar22;
  size_t i_2;
  int ic;
  ulong uVar23;
  int ir;
  long lVar24;
  ulong uVar25;
  float fVar26;
  size_t sStackY_1750;
  allocator<char> local_1721;
  undefined8 local_1720;
  int local_1718;
  uint local_1714;
  ulong local_1710;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> v_diff_filtered;
  vector<float,_std::allocator<float>_> local_16e8;
  tokenized_prompt t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positive_prompts;
  char *local_1660;
  ggml_tensor *local_1658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  negative_prompts;
  train_context ctx_train;
  vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> tokenized_prompts;
  float d;
  undefined8 local_1540 [4];
  undefined8 local_1520 [4];
  common_init_result llama_init;
  callback_data cb_data;
  string local_1478;
  string local_1458;
  string local_1438;
  string local_1418 [32];
  char model_hint [128];
  common_params params;
  
  common_params::common_params(&params);
  std::__cxx11::string::assign((char *)&params.out_file);
  bVar6 = common_params_parse(argc,argv,&params,LLAMA_EXAMPLE_CVECTOR_GENERATOR,print_usage);
  iVar8 = 1;
  if (!bVar6) goto LAB_00130dc6;
  if (params.n_pca_iterations % params.n_pca_batch != 0) {
    fwrite("PCA iterations must by multiply of PCA batch size\n",0x32,1,_stderr);
    goto LAB_00130dc6;
  }
  params.cb_eval_user_data = &cb_data;
  cb_data.ctx_ggml = (ggml_context *)0x0;
  cb_data.n_layers = 0;
  cb_data.n_tokens = 0;
  cb_data.is_eval_pos = true;
  cb_data.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cb_data.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cb_data.v_pos.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cb_data.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cb_data.v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cb_data.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cb_data.v_neg.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cb_data.v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cb_data.v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  params.cb_eval = cb_eval;
  params.warmup = false;
  fprintf(_stderr,"%s: build = %d (%s)\n","main",(ulong)(uint)LLAMA_BUILD_NUMBER,LLAMA_COMMIT);
  fprintf(_stderr,"%s: built with %s for %s\n","main",LLAMA_COMPILER,LLAMA_BUILD_TARGET);
  llama_backend_init();
  llama_numa_init(params.numa);
  common_init_from_params(&llama_init,&params);
  local_1718 = llama_model_n_layer(llama_init.model._M_t.
                                   super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                                   super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                                   super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
  iVar8 = llama_model_n_embd(llama_init.model._M_t.
                             super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                             super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                             super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
  llama_model_meta_val_str
            (llama_init.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
             super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
             super__Head_base<0UL,_llama_model_*,_false>._M_head_impl,"general.architecture",
             model_hint,0x80);
  train_context::train_context(&ctx_train,iVar8,local_1718);
  std::__cxx11::string::string((string *)&t,(string *)&params.cvector_positive_file);
  ctrlvec_load_prompt_file(&positive_prompts,(string *)&t,skip_empty_lines);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&v_diff_filtered,(string *)&params.cvector_negative_file);
  ctrlvec_load_prompt_file(&negative_prompts,(string *)&v_diff_filtered,skip_empty_lines_00);
  std::__cxx11::string::~string((string *)&v_diff_filtered);
  if ((long)positive_prompts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)positive_prompts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)negative_prompts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)negative_prompts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    if (positive_prompts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        positive_prompts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar22 = "must provide at least one prompt pair\n";
      sStackY_1750 = 0x26;
      goto LAB_00131db7;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&ctx_train.positive_entries,&positive_prompts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&ctx_train.negative_entries,&negative_prompts);
  }
  else {
    pcVar22 = "number of positive and negative prompts must be equal\n";
    sStackY_1750 = 0x36;
LAB_00131db7:
    fwrite(pcVar22,sStackY_1750,1,_stderr);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&negative_prompts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&positive_prompts);
  tokenized_prompts.super__Vector_base<tokenized_prompt,_std::allocator<tokenized_prompt>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tokenized_prompts.super__Vector_base<tokenized_prompt,_std::allocator<tokenized_prompt>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tokenized_prompts.super__Vector_base<tokenized_prompt,_std::allocator<tokenized_prompt>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar24 = 0;
  local_1720 = 0;
  for (uVar21 = 0;
      uVar21 < (ulong)((long)ctx_train.positive_entries.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)ctx_train.positive_entries.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar21 = uVar21 + 1) {
    std::__cxx11::string::string
              ((string *)&local_1458,
               (string *)
               ((long)&((ctx_train.positive_entries.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar24));
    std::__cxx11::string::string
              ((string *)&local_1478,
               (string *)
               ((long)&((ctx_train.negative_entries.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar24));
    tokenized_prompt::tokenized_prompt
              (&t,(llama_context *)
                  llama_init.context._M_t.
                  super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                  super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&local_1458,&local_1478
              );
    std::__cxx11::string::~string((string *)&local_1478);
    std::__cxx11::string::~string((string *)&local_1458);
    lVar16 = CONCAT44(t.max_seq_len._4_4_,(uint)t.max_seq_len);
    std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::emplace_back<tokenized_prompt>
              (&tokenized_prompts,&t);
    local_1720 = local_1720 + lVar16 * 2;
    tokenized_prompt::~tokenized_prompt(&t);
    lVar24 = lVar24 + 0x20;
  }
  poVar10 = std::operator<<((ostream *)&std::cout,"n_total_tokens: ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::endl<char,std::char_traits<char>>(poVar10);
  __return_storage_ptr__ = (string *)&v_diff_filtered;
  lVar24 = 0;
  uVar21 = 0;
  while (uVar21 < (ulong)((long)ctx_train.positive_entries.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)ctx_train.positive_entries.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_1720 = lVar24;
    tokenized_prompt::tokenized_prompt
              (&t,(tokenized_prompt *)
                  ((long)&((tokenized_prompts.
                            super__Vector_base<tokenized_prompt,_std::allocator<tokenized_prompt>_>.
                            _M_impl.super__Vector_impl_data._M_start)->tokens_pos).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar24));
    cb_data.n_tokens = (uint)t.max_seq_len;
    cb_data.n_layers = local_1718;
    uVar23 = (long)ctx_train.positive_entries.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)ctx_train.positive_entries.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              (__return_storage_ptr__,
               (llama_context *)
               llama_init.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
               _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
               super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    ppgVar4 = v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((string *)&positive_prompts,
               (llama_context *)
               llama_init.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
               _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
               super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               t.tokens_neg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               t.tokens_neg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    uVar21 = uVar21 + 1;
    printf("Evaluating prompt[%d/%d]: \"%s\" - \"%s\" (%d tokens)\n",uVar21 & 0xffffffff,
           uVar23 >> 5 & 0xffffffff,ppgVar4,
           positive_prompts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,(ulong)(uint)t.max_seq_len);
    std::__cxx11::string::~string((string *)&positive_prompts);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    cb_data.is_eval_pos = true;
    bVar6 = get_hidden_layers((llama_context *)
                              llama_init.context._M_t.
                              super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                              super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
                              &t.tokens_pos);
    if (!bVar6) {
LAB_001312b4:
      tokenized_prompt::~tokenized_prompt(&t);
      break;
    }
    cb_data.is_eval_pos = false;
    bVar6 = get_hidden_layers((llama_context *)
                              llama_init.context._M_t.
                              super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                              super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
                              &t.tokens_neg);
    if (!bVar6) goto LAB_001312b4;
    callback_data::calc_diff
              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)__return_storage_ptr__,
               &cb_data);
    train_context::concat_diff_tmp
              (&ctx_train,
               (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)__return_storage_ptr__);
    callback_data::reset(&cb_data);
    std::_Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::~_Vector_base
              ((_Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)__return_storage_ptr__
              );
    tokenized_prompt::~tokenized_prompt(&t);
    lVar24 = local_1720 + 0x38;
  }
  puts("Done evaluate prompts, unload model...");
  train_context::build_v_diff(&ctx_train,params.cvector_dimre_method == DIMRE_METHOD_PCA);
  if (params.cvector_dimre_method == DIMRE_METHOD_PCA) {
    printf("%s: Running PCA...\n","run_pca");
    iVar8 = 0;
    if (0 < params.n_pca_batch) {
      iVar8 = params.n_pca_batch;
    }
    local_1660 = "params.n_batch > 0";
    uVar21 = 0;
    local_1710 = (ulong)(uint)params.n_pca_batch;
    while (uVar21 < (ulong)((long)ctx_train.v_diff.
                                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)ctx_train.v_diff.
                                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3)) {
      pgVar2 = ctx_train.v_final.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      ggml_format_name(pgVar2,"direction.%zu");
      ppgVar5 = ctx_train.v_diff.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppgVar4 = ctx_train.v_diff.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      PCA::pca_model::pca_model
                ((pca_model *)&t,
                 ctx_train.v_diff.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar21]);
      uVar17 = ggml_backend_get_default_buffer_type
                         (t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      uVar17 = ggml_gallocr_new(uVar17);
      local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar9 = params.n_pca_iterations / (int)local_1710;
      local_1658 = (ggml_tensor *)0x0;
      uVar18 = uVar9;
      if ((int)uVar9 < 1) {
        uVar18 = 0;
      }
      uVar23 = (ulong)((int)uVar21 + 1);
      uVar20 = 0;
      while (local_1714 = uVar20, uVar20 != uVar18) {
        if ((int)local_1710 < 1) {
          uVar17 = 0x8a;
LAB_00131dee:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                     ,uVar17,"GGML_ASSERT(%s) failed",local_1660);
        }
        if ((PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size ==
             '\0') &&
           (iVar19 = __cxa_guard_acquire(&PCA::
                                          build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                          ::buf_size), iVar19 != 0)) {
          lVar24 = ggml_tensor_overhead();
          lVar16 = ggml_graph_overhead();
          PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size =
               (pointer)(lVar16 + lVar24 * 0x800);
          __cxa_guard_release(&PCA::
                               build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                               ::buf_size);
        }
        if ((PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf == '\0')
           && (iVar19 = __cxa_guard_acquire(&PCA::
                                             build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                             ::buf), iVar19 != 0)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf
                     ,(size_type)
                      PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::
                      buf_size,(allocator_type *)&positive_prompts);
          __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                       &PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::
                        buf,&__dso_handle);
          __cxa_guard_release(&PCA::
                               build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                               ::buf);
        }
        positive_prompts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size;
        positive_prompts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             PCA::build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf;
        positive_prompts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
        uVar11 = ggml_init();
        local_1720 = ggml_new_graph(uVar11);
        if (local_1714 == 0) {
          __return_storage_ptr__ =
               (string *)
               ggml_mul_mat(uVar11,t.tokens_neg.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
          ggml_set_name(__return_storage_ptr__,"tmp_square");
        }
        if (local_1714 != 0) {
          __return_storage_ptr__ =
               (string *)
               t.tokens_neg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        uVar14 = CONCAT44(t.max_seq_len._4_4_,(uint)t.max_seq_len);
        for (iVar19 = 0; iVar8 != iVar19; iVar19 = iVar19 + 1) {
          uVar12 = ggml_mul_mat(uVar11,__return_storage_ptr__,uVar14);
          ggml_set_name(uVar12,"b_tensor");
          uVar13 = ggml_sqr(uVar11,uVar12);
          uVar13 = ggml_sum_rows(uVar11,uVar13);
          uVar13 = ggml_sqrt_inplace(uVar11,uVar13);
          uVar12 = ggml_div_inplace(uVar11,uVar12,uVar13);
          ggml_format_name(uVar12,"b_tensor_norm_%d",iVar19);
          uVar13 = ggml_scale(0xbf800000,uVar11,uVar12);
          uVar14 = ggml_add(uVar11,uVar14,uVar13);
          uVar14 = ggml_sqr_inplace(uVar11,uVar14);
          uVar14 = ggml_sum_rows(uVar11,uVar14);
          uVar14 = ggml_sqrt_inplace(uVar11,uVar14);
          ggml_format_name(uVar14,"distance_%d",iVar19);
          ggml_build_forward_expand(local_1720,uVar14);
          uVar14 = uVar12;
        }
        ggml_free(uVar11);
        ggml_gallocr_alloc_graph(uVar17,local_1720);
        cVar7 = ggml_backend_is_cpu(t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
        if (cVar7 != '\0') {
          ggml_backend_cpu_set_n_threads
                    (t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,params.cpuparams.n_threads);
        }
        iVar19 = ggml_backend_graph_compute
                           (t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
        if (iVar19 == 0) {
          v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage !=
              v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          if (local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::resize
                    ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                     &v_diff_filtered.
                      super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                      super__Vector_impl_data._M_finish,local_1710);
          std::vector<float,_std::allocator<float>_>::resize(&local_16e8,local_1710);
          local_1718 = 0;
          while (iVar19 = ggml_graph_n_nodes(local_1720), local_1718 < iVar19) {
            pgVar15 = (ggml_tensor *)ggml_graph_node(local_1720);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&positive_prompts,"b_tensor_norm_",(allocator<char> *)&d);
            pcVar22 = pgVar15->name;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&negative_prompts,pcVar22,&local_1721);
            __return_storage_ptr__ = (string *)&positive_prompts;
            uVar20 = PCA::compute_piter::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)__return_storage_ptr__,
                                (string *)&negative_prompts,str);
            std::__cxx11::string::~string((string *)&negative_prompts);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            if (-1 < (int)uVar20) {
              v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[uVar20] = pgVar15;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1418,"distance_",(allocator<char> *)&d);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1438,pcVar22,&local_1721);
            uVar20 = PCA::compute_piter::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)local_1418,&local_1438,str_00);
            std::__cxx11::string::~string((string *)&local_1438);
            std::__cxx11::string::~string(local_1418);
            if (-1 < (int)uVar20) {
              ggml_backend_tensor_get(pgVar15,&d,0,4);
              local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20] = d;
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&d,pcVar22,&local_1721);
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&d,"tmp_square");
            std::__cxx11::string::~string((string *)&d);
            if (bVar6) {
              v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)pgVar15;
            }
            local_1718 = local_1718 + 1;
          }
        }
        lVar24 = 0;
        do {
          if ((long)local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 == lVar24) break;
          pfVar1 = local_16e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar24;
          local_1658 = v_diff_filtered.
                       super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[lVar24];
          lVar24 = lVar24 + 1;
        } while (1e-07 < *pfVar1 || *pfVar1 == 1e-07);
        if (local_1714 == 0) {
          if (v_diff_filtered.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            uVar17 = 0x110;
            local_1660 = "result.calculated_square != NULL";
            goto LAB_00131dee;
          }
          ggml_backend_tensor_copy
                    (v_diff_filtered.
                     super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     t.tokens_neg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        }
        if (local_1658 == (ggml_tensor *)0x0) {
          uVar17 = 0x116;
          local_1660 = "last_eigenvector != NULL";
          goto LAB_00131dee;
        }
        ggml_backend_tensor_copy(local_1658,CONCAT44(t.max_seq_len._4_4_,(uint)t.max_seq_len));
        uVar20 = local_1714 + 1;
        printf("%s: layer %d/%d, iteration: %d / total: %d (batch = %d) ...\n","power_iteration",
               uVar23,(ulong)((long)ppgVar5 - (long)ppgVar4) >> 3,(ulong)uVar20,(ulong)uVar9,
               (int)local_1710);
      }
      if (local_1658 == (ggml_tensor *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
                   ,0x11f,"GGML_ASSERT(%s) failed","last_eigenvector");
      }
      pvVar3 = pgVar2->data;
      uVar11 = ggml_nbytes(local_1658);
      ggml_backend_tensor_get(local_1658,pvVar3,0,uVar11);
      ggml_gallocr_free(uVar17);
      PCA::pca_result::~pca_result((pca_result *)&v_diff_filtered);
      PCA::pca_model::~pca_model((pca_model *)&t);
      printf("%s: Done layer %d / %d\n","run_pca",uVar23,
             (ulong)((long)ctx_train.v_diff.
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)ctx_train.v_diff.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
      uVar21 = uVar21 + 1;
    }
  }
  else {
    printf("%s: Running mean...\n","run");
    uVar21 = 0;
    while (uVar21 < (ulong)((long)ctx_train.v_diff.
                                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)ctx_train.v_diff.
                                  super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3)) {
      pgVar2 = ctx_train.v_final.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      ggml_format_name(pgVar2,"direction.%zu",uVar21 + 1);
      pgVar15 = ctx_train.v_diff.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar21];
      lVar24 = pgVar15->ne[0];
      if (lVar24 != pgVar2->ne[0]) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/mean.hpp"
                   ,0x16,"GGML_ASSERT(%s) failed","t_layer->ne[0] == ctrl_out->ne[0]");
      }
      for (uVar23 = 0; (long)uVar23 < lVar24; uVar23 = uVar23 + 1) {
        local_1720 = (ulong)local_1720._4_4_ << 0x20;
        for (uVar25 = 0; (long)uVar25 < pgVar15->ne[1]; uVar25 = uVar25 + 1) {
          fVar26 = (float)ggml_get_f32_nd(pgVar15,uVar23 & 0xffffffff,uVar25 & 0xffffffff,0,0);
          local_1720 = CONCAT44(local_1720._4_4_,(float)local_1720 + fVar26);
        }
        ggml_set_f32_1d((float)local_1720 / (float)pgVar15->ne[1],pgVar2,uVar23 & 0xffffffff);
        lVar24 = pgVar15->ne[0];
      }
      local_1720._0_4_ = 0.0;
      for (uVar23 = 0; lVar24 = ggml_nelements(pgVar2), (long)uVar23 < lVar24; uVar23 = uVar23 + 1)
      {
        fVar26 = (float)ggml_get_f32_1d(pgVar2,uVar23 & 0xffffffff);
        local_1720._0_4_ = (float)local_1720 + fVar26 * fVar26;
      }
      if ((float)local_1720 < 0.0) {
        local_1720._0_4_ = sqrtf((float)local_1720);
      }
      else {
        local_1720._0_4_ = SQRT((float)local_1720);
      }
      for (uVar23 = 0; lVar24 = ggml_nelements(pgVar2), (long)uVar23 < lVar24; uVar23 = uVar23 + 1)
      {
        fVar26 = (float)ggml_get_f32_1d(pgVar2,uVar23 & 0xffffffff);
        ggml_set_f32_1d(fVar26 / (float)local_1720,pgVar2,uVar23 & 0xffffffff);
      }
      printf("%s: Done layer %d / %d\n","run",(ulong)((int)uVar21 + 1),
             (ulong)((long)ctx_train.v_diff.
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)ctx_train.v_diff.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
      uVar21 = uVar21 + 1;
    }
  }
  std::__cxx11::string::string((string *)local_1540,(string *)&params.out_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1520,model_hint,(allocator<char> *)&positive_prompts);
  uVar17 = gguf_init_empty();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"controlvector",(allocator<char> *)&v_diff_filtered);
  gguf_set_val_str(uVar17,"general.architecture",
                   t.tokens_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &v_diff_filtered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                 ".model_hint");
  gguf_set_val_str(uVar17,v_diff_filtered.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start,local_1520[0]);
  std::__cxx11::string::~string((string *)&v_diff_filtered);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &v_diff_filtered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                 ".layer_count");
  gguf_set_val_i32(uVar17,v_diff_filtered.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   (ulong)((long)ctx_train.v_final.
                                 super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)ctx_train.v_final.
                                super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
  std::__cxx11::string::~string((string *)&v_diff_filtered);
  for (uVar21 = 0;
      uVar21 < (ulong)((long)ctx_train.v_final.
                             super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)ctx_train.v_final.
                             super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar21 = uVar21 + 1) {
    with_data = SUB81(ctx_train.v_final.
                      super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar21],0);
    gguf_add_tensor(uVar17);
    print_debug_tensor(ctx_train.v_final.
                       super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21],(bool)with_data);
    printf("Added tensor: %s\n",
           ctx_train.v_final.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar21]->name);
  }
  printf("%s: writing file...\n","export_gguf");
  gguf_write_to_file(uVar17,local_1540[0],0);
  printf("%s: wrote file \'%s\'\n","export_gguf",local_1540[0]);
  gguf_free(uVar17);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)local_1520);
  std::__cxx11::string::~string((string *)local_1540);
  llama_backend_free();
  std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::~vector(&tokenized_prompts);
  train_context::~train_context(&ctx_train);
  common_init_result::~common_init_result(&llama_init);
  callback_data::~callback_data(&cb_data);
  iVar8 = 0;
LAB_00130dc6:
  common_params::~common_params(&params);
  return iVar8;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.out_file = "control_vector.gguf";

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_CVECTOR_GENERATOR, print_usage)) {
        return 1;
    }

    if (params.n_pca_iterations % params.n_pca_batch != 0) {
        fprintf(stderr, "PCA iterations must by multiply of PCA batch size\n");
        return 1;
    }


    callback_data cb_data;

    // pass the callback to the backend scheduler
    // it will be executed for each node during the graph computation
    params.cb_eval = cb_eval;
    params.cb_eval_user_data = &cb_data;
    params.warmup = false;

    print_build_info();
    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model to get hparams
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    // int n_ctx = llama_n_ctx(ctx);
    int n_layers = llama_model_n_layer(model);
    int n_embd = llama_model_n_embd(model);

    // get model hint param (a.k.a model arch name)
    char model_hint[128];
    llama_model_meta_val_str(model, "general.architecture", model_hint, 128);

    // init train_context
    train_context ctx_train(n_embd, n_layers);

    // load and prepare entries for training
    prepare_entries(params, ctx_train);

    // we have to pretokenize everything because otherwise we don't know how much overhead to allocate ctx_diffs_wrapped
    std::vector<tokenized_prompt> tokenized_prompts;
    size_t n_total_tokens = 0;
    for (size_t i = 0; i < ctx_train.positive_entries.size(); ++i) {
        tokenized_prompt t(ctx, ctx_train.positive_entries[i], ctx_train.negative_entries[i]);
        n_total_tokens += 2 * t.max_seq_len;
        tokenized_prompts.push_back(std::move(t));
    }

    std::cout << "n_total_tokens: " << n_total_tokens << std::endl;

    for(size_t i = 0; i < ctx_train.positive_entries.size(); ++i) {
        bool success = false;
        tokenized_prompt t = tokenized_prompts[i];
        cb_data.n_layers = n_layers;
        cb_data.n_tokens = t.max_seq_len;

        printf("Evaluating prompt[%d/%d]: \"%s\" - \"%s\" (%d tokens)\n",
            (int) i+1, (int) ctx_train.positive_entries.size(),
            tokens_to_str(ctx, t.tokens_pos.cbegin(), t.tokens_pos.cend()).c_str(),
            tokens_to_str(ctx, t.tokens_neg.cbegin(), t.tokens_neg.cend()).c_str(),
            (int) t.max_seq_len);

        cb_data.is_eval_pos = true;
        success = get_hidden_layers(ctx, t.tokens_pos);
        if (!success) break;

        cb_data.is_eval_pos = false;
        success = get_hidden_layers(ctx, t.tokens_neg);
        if (!success) break;

        // calculate diff and remove all zero rows
        auto v_diff_filtered = cb_data.calc_diff();

        // save & concat the filtered v_diff to ctx_train
        ctx_train.concat_diff_tmp(v_diff_filtered);

        // reset for next iteration
        cb_data.reset();
    }

    // done with the model, we can now free it to make gain some memory
    printf("Done evaluate prompts, unload model...\n");

    bool use_pca = params.cvector_dimre_method == DIMRE_METHOD_PCA;

    // prepare ctx_train for PCA
    ctx_train.build_v_diff(use_pca);

    if (use_pca) {
        // run PCA
        PCA::pca_params pca_params;
        pca_params.n_threads    = params.cpuparams.n_threads;
        pca_params.n_batch      = params.n_pca_batch;
        pca_params.n_iterations = params.n_pca_iterations;
        PCA::run_pca(pca_params, ctx_train.v_diff, ctx_train.v_final);
    } else {
        // run mean
        mean::run(ctx_train.v_diff, ctx_train.v_final);
    }

    // write output vectors to gguf
    export_gguf(ctx_train.v_final, params.out_file, model_hint);

    llama_backend_free();

    return 0;
}